

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  float fVar1;
  value_type vVar2;
  ushort uVar3;
  int iVar4;
  value_type *pvVar5;
  value_type *pvVar6;
  value_type_conflict *pvVar7;
  Glyph *pGVar8;
  float local_50;
  int local_2c;
  int i_2;
  Glyph *tab_glyph;
  int codepoint;
  int i_1;
  int i;
  int max_codepoint;
  ImFont *this_local;
  
  i_1 = 0;
  for (codepoint = 0; codepoint != (this->Glyphs).Size; codepoint = codepoint + 1) {
    pvVar5 = ImVector<ImFont::Glyph>::operator[](&this->Glyphs,codepoint);
    i_1 = ImMax(i_1,(uint)pvVar5->Codepoint);
  }
  if ((this->Glyphs).Size < 0xffff) {
    ImVector<float>::clear(&this->IndexXAdvance);
    ImVector<unsigned_short>::clear(&this->IndexLookup);
    GrowIndex(this,i_1 + 1);
    for (tab_glyph._4_4_ = 0; tab_glyph._4_4_ < (this->Glyphs).Size;
        tab_glyph._4_4_ = tab_glyph._4_4_ + 1) {
      pvVar5 = ImVector<ImFont::Glyph>::operator[](&this->Glyphs,tab_glyph._4_4_);
      uVar3 = pvVar5->Codepoint;
      pvVar5 = ImVector<ImFont::Glyph>::operator[](&this->Glyphs,tab_glyph._4_4_);
      fVar1 = pvVar5->XAdvance;
      pvVar6 = ImVector<float>::operator[](&this->IndexXAdvance,(uint)uVar3);
      *pvVar6 = fVar1;
      pvVar7 = ImVector<unsigned_short>::operator[](&this->IndexLookup,(uint)uVar3);
      *pvVar7 = (value_type_conflict)tab_glyph._4_4_;
    }
    pGVar8 = FindGlyph(this,0x20);
    if (pGVar8 != (Glyph *)0x0) {
      pvVar5 = ImVector<ImFont::Glyph>::back(&this->Glyphs);
      if (pvVar5->Codepoint != 9) {
        ImVector<ImFont::Glyph>::resize(&this->Glyphs,(this->Glyphs).Size + 1);
      }
      pvVar5 = ImVector<ImFont::Glyph>::back(&this->Glyphs);
      pGVar8 = FindGlyph(this,0x20);
      memcpy(pvVar5,pGVar8,0x28);
      pvVar5->Codepoint = 9;
      pvVar5->XAdvance = pvVar5->XAdvance * 4.0;
      fVar1 = pvVar5->XAdvance;
      pvVar6 = ImVector<float>::operator[](&this->IndexXAdvance,(uint)pvVar5->Codepoint);
      *pvVar6 = fVar1;
      iVar4 = (this->Glyphs).Size;
      pvVar7 = ImVector<unsigned_short>::operator[](&this->IndexLookup,(uint)pvVar5->Codepoint);
      *pvVar7 = (short)iVar4 - 1;
    }
    this->FallbackGlyph = (Glyph *)0x0;
    pGVar8 = FindGlyph(this,this->FallbackChar);
    this->FallbackGlyph = pGVar8;
    if (this->FallbackGlyph == (Glyph *)0x0) {
      local_50 = 0.0;
    }
    else {
      local_50 = this->FallbackGlyph->XAdvance;
    }
    this->FallbackXAdvance = local_50;
    for (local_2c = 0; local_2c < i_1 + 1; local_2c = local_2c + 1) {
      pvVar6 = ImVector<float>::operator[](&this->IndexXAdvance,local_2c);
      if (*pvVar6 <= 0.0 && *pvVar6 != 0.0) {
        vVar2 = this->FallbackXAdvance;
        pvVar6 = ImVector<float>::operator[](&this->IndexXAdvance,local_2c);
        *pvVar6 = vVar2;
      }
    }
    return;
  }
  __assert_fail("Glyphs.Size < 0xFFFF",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                ,0x6af,"void ImFont::BuildLookupTable()");
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexXAdvance.clear();
    IndexLookup.clear();
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexXAdvance[codepoint] = Glyphs[i].XAdvance;
        IndexLookup[codepoint] = (unsigned short)i;
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((unsigned short)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times
            Glyphs.resize(Glyphs.Size + 1);
        ImFont::Glyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((unsigned short)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.XAdvance *= 4;
        IndexXAdvance[(int)tab_glyph.Codepoint] = (float)tab_glyph.XAdvance;
        IndexLookup[(int)tab_glyph.Codepoint] = (unsigned short)(Glyphs.Size-1);
    }

    FallbackGlyph = NULL;
    FallbackGlyph = FindGlyph(FallbackChar);
    FallbackXAdvance = FallbackGlyph ? FallbackGlyph->XAdvance : 0.0f;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexXAdvance[i] < 0.0f)
            IndexXAdvance[i] = FallbackXAdvance;
}